

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool parseDouble(Option *O,StringRef Arg,double *Value)

{
  double *this;
  bool bVar1;
  raw_ostream *Errs;
  StringRef local_a0;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  double *local_30;
  double *Value_local;
  Option *O_local;
  StringRef Arg_local;
  
  Arg_local.Data = (char *)Arg.Length;
  O_local = (Option *)Arg.Data;
  local_30 = Value;
  Value_local = (double *)O;
  llvm::Twine::Twine(&local_48,(StringRef *)&O_local);
  bVar1 = llvm::to_float(&local_48,local_30);
  this = Value_local;
  if (bVar1) {
    Arg_local.Length._7_1_ = false;
  }
  else {
    llvm::operator+(&local_78,"\'",(StringRef *)&O_local);
    llvm::Twine::Twine(&local_90,"\' value invalid for floating point argument!");
    llvm::operator+(&local_60,&local_78,&local_90);
    memset(&local_a0,0,0x10);
    llvm::StringRef::StringRef(&local_a0);
    Errs = llvm::errs();
    Arg_local.Length._7_1_ = llvm::cl::Option::error((Option *)this,&local_60,local_a0,Errs);
  }
  return Arg_local.Length._7_1_;
}

Assistant:

static bool parseDouble(Option &O, StringRef Arg, double &Value) {
  if (to_float(Arg, Value))
    return false;
  return O.error("'" + Arg + "' value invalid for floating point argument!");
}